

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# entropy_encode.cpp
# Opt level: O0

void duckdb_brotli::BrotliWriteHuffmanTree
               (uint8_t *depth,size_t length,size_t *tree_size,uint8_t *tree,
               uint8_t *extra_bits_data)

{
  uint8_t uVar1;
  size_t *psVar2;
  size_t *tree_size_00;
  size_t *in_RSI;
  uint8_t *in_RDI;
  bool bVar3;
  size_t k;
  size_t reps;
  uint8_t value;
  size_t new_length;
  int use_rle_for_zero;
  int use_rle_for_non_zero;
  size_t i;
  uint8_t previous_value;
  size_t *in_stack_ffffffffffffffa0;
  uint8_t *tree_00;
  uint7 in_stack_ffffffffffffffb0;
  int iVar4;
  undefined2 uVar5;
  uint8_t value_00;
  uint8_t previous_value_00;
  size_t *local_38;
  
  uVar5 = 0;
  value_00 = '\0';
  previous_value_00 = '\0';
  iVar4 = 0;
  local_38 = (size_t *)0x0;
  tree_size_00 = in_RSI;
  while ((local_38 < in_RSI && (in_RDI[(long)in_RSI + (-1 - (long)local_38)] == '\0'))) {
    tree_size_00 = (size_t *)((long)tree_size_00 - 1);
    local_38 = (size_t *)((long)local_38 + 1);
  }
  if ((size_t *)0x32 < in_RSI) {
    DecideOverRleUse(in_RDI,(size_t)tree_size_00,(int *)&stack0xffffffffffffffc4,
                     (int *)&stack0xffffffffffffffc0);
  }
  for (local_38 = (size_t *)0x0; local_38 < tree_size_00;
      local_38 = (size_t *)(tree_00 + (long)local_38)) {
    uVar1 = in_RDI[(long)local_38];
    tree_00 = (uint8_t *)0x1;
    psVar2 = local_38;
    if (((uVar1 != '\0') && (CONCAT13(previous_value_00,CONCAT12(value_00,uVar5)) != 0)) ||
       ((uVar1 == '\0' && (iVar4 != 0)))) {
      while( true ) {
        in_stack_ffffffffffffffa0 = (size_t *)((long)psVar2 + 1);
        bVar3 = false;
        if (in_stack_ffffffffffffffa0 < tree_size_00) {
          bVar3 = in_RDI[(long)in_stack_ffffffffffffffa0] == uVar1;
        }
        if (!bVar3) break;
        tree_00 = tree_00 + 1;
        psVar2 = in_stack_ffffffffffffffa0;
      }
    }
    if (uVar1 == '\0') {
      BrotliWriteHuffmanTreeRepetitionsZeros
                (CONCAT17(previous_value_00,CONCAT16(value_00,CONCAT24(uVar5,iVar4))),tree_size_00,
                 (uint8_t *)(ulong)in_stack_ffffffffffffffb0,tree_00);
    }
    else {
      BrotliWriteHuffmanTreeRepetitions
                (previous_value_00,value_00,(size_t)tree_size_00,
                 (size_t *)CONCAT17(uVar1,in_stack_ffffffffffffffb0),tree_00,
                 (uint8_t *)in_stack_ffffffffffffffa0);
    }
  }
  return;
}

Assistant:

void duckdb_brotli::BrotliWriteHuffmanTree(const uint8_t* depth,
                            size_t length,
                            size_t* tree_size,
                            uint8_t* tree,
                            uint8_t* extra_bits_data) {
  uint8_t previous_value = BROTLI_INITIAL_REPEATED_CODE_LENGTH;
  size_t i;
  BROTLI_BOOL use_rle_for_non_zero = BROTLI_FALSE;
  BROTLI_BOOL use_rle_for_zero = BROTLI_FALSE;

  /* Throw away trailing zeros. */
  size_t new_length = length;
  for (i = 0; i < length; ++i) {
    if (depth[length - i - 1] == 0) {
      --new_length;
    } else {
      break;
    }
  }

  /* First gather statistics on if it is a good idea to do RLE. */
  if (length > 50) {
    /* Find RLE coding for longer codes.
       Shorter codes seem not to benefit from RLE. */
    DecideOverRleUse(depth, new_length,
                     &use_rle_for_non_zero, &use_rle_for_zero);
  }

  /* Actual RLE coding. */
  for (i = 0; i < new_length;) {
    const uint8_t value = depth[i];
    size_t reps = 1;
    if ((value != 0 && use_rle_for_non_zero) ||
        (value == 0 && use_rle_for_zero)) {
      size_t k;
      for (k = i + 1; k < new_length && depth[k] == value; ++k) {
        ++reps;
      }
    }
    if (value == 0) {
      BrotliWriteHuffmanTreeRepetitionsZeros(
          reps, tree_size, tree, extra_bits_data);
    } else {
      BrotliWriteHuffmanTreeRepetitions(previous_value,
                                        value, reps, tree_size,
                                        tree, extra_bits_data);
      previous_value = value;
    }
    i += reps;
  }
}